

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextBlockData>::erase_single(QFragmentMapData<QTextBlockData> *this,uint z)

{
  int *piVar1;
  undefined4 uVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  Header *pHVar6;
  uint p;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint x;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  quint32 qVar17;
  ulong uVar18;
  
  uVar9 = (ulong)z;
  uVar3 = previous(this,z);
  pHVar6 = (this->field_0).head;
  lVar16 = uVar9 * 0x48;
  puVar4 = (uint *)((long)pHVar6 + lVar16 + 8);
  uVar8 = (ulong)*(uint *)((long)pHVar6 + lVar16 + 4);
  if (uVar8 == 0) {
LAB_00464acf:
    uVar18 = (ulong)*puVar4;
  }
  else {
    uVar7 = *puVar4;
    if (*puVar4 == 0) {
      puVar4 = (uint *)((long)pHVar6 + lVar16 + 4);
      goto LAB_00464acf;
    }
    do {
      uVar14 = uVar7;
      uVar10 = (ulong)uVar14;
      lVar5 = uVar10 * 0x48;
      uVar7 = *(uint *)((long)pHVar6 + lVar5 + 4);
    } while (uVar7 != 0);
    uVar7 = *(uint *)((long)pHVar6 + lVar5 + 8);
    uVar18 = (ulong)uVar7;
    if (uVar14 != z) {
      *(uint *)((long)pHVar6 + uVar8 * 0x48) = uVar14;
      *(undefined4 *)((long)(this->field_0).head + lVar5 + 4) =
           *(undefined4 *)((long)(this->field_0).head + lVar16 + 4);
      for (lVar15 = 0; pHVar6 = (this->field_0).head, lVar15 != 3; lVar15 = lVar15 + 1) {
        *(undefined4 *)((long)pHVar6 + lVar15 * 4 + uVar10 * 0x48 + 0x10) =
             *(undefined4 *)((long)pHVar6 + lVar15 * 4 + lVar16 + 0x10);
      }
      if (uVar14 == *(uint *)((long)pHVar6 + lVar16 + 8)) {
        uVar8 = (ulong)uVar14;
      }
      else {
        uVar8 = (ulong)*(uint *)((long)pHVar6 + lVar5);
        if (uVar7 != 0) {
          *(uint *)((long)pHVar6 + uVar18 * 0x48) = *(uint *)((long)pHVar6 + lVar5);
          pHVar6 = (this->field_0).head;
        }
        *(uint *)((long)pHVar6 + uVar8 * 0x48 + 4) = uVar7;
        *(undefined4 *)((long)(this->field_0).head + lVar5 + 8) =
             *(undefined4 *)((long)(this->field_0).head + lVar16 + 8);
        *(uint *)((long)(this->field_0).head +
                 (ulong)*(uint *)((long)(this->field_0).head + lVar16 + 8) * 0x48) = uVar14;
        for (uVar12 = uVar8; (uint)uVar12 != uVar14;
            uVar12 = (ulong)*(uint *)((long)pHVar6 + uVar12 * 0x48)) {
          for (lVar15 = 0; pHVar6 = (this->field_0).head, lVar15 != 3; lVar15 = lVar15 + 1) {
            piVar1 = (int *)((long)pHVar6 + lVar15 * 4 + uVar12 * 0x48 + 0x10);
            *piVar1 = *piVar1 - *(int *)((long)pHVar6 + lVar15 * 4 + uVar10 * 0x48 + 0x1c);
          }
        }
        pHVar6 = (this->field_0).head;
      }
      uVar7 = *(uint *)((long)pHVar6 + lVar16);
      if ((ulong)uVar7 == 0) {
        pHVar6->root = uVar14;
      }
      else {
        lVar15 = (ulong)uVar7 * 0x48;
        if (*(uint *)((long)pHVar6 + lVar15 + 4) == z) {
          *(uint *)((long)pHVar6 + lVar15 + 4) = uVar14;
          for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
            piVar1 = (int *)((long)(this->field_0).head + lVar13 * 4 + lVar15 + 0x10);
            *piVar1 = *piVar1 - *(int *)((long)(this->field_0).head + lVar13 * 4 + lVar16 + 0x1c);
          }
        }
        else {
          *(uint *)((long)pHVar6 + lVar15 + 8) = uVar14;
        }
      }
      *(uint *)((long)(this->field_0).head + lVar5) = uVar7;
      pHVar6 = (this->field_0).head;
      uVar2 = *(undefined4 *)((long)pHVar6 + lVar5 + 0xc);
      *(undefined4 *)((long)pHVar6 + lVar5 + 0xc) = *(undefined4 *)((long)pHVar6 + lVar16 + 0xc);
      *(undefined4 *)((long)(this->field_0).head + lVar16 + 0xc) = uVar2;
      goto LAB_00464c30;
    }
  }
  uVar7 = *(uint *)((long)pHVar6 + lVar16);
  uVar8 = (ulong)uVar7;
  qVar17 = (quint32)uVar18;
  if (qVar17 != 0) {
    *(uint *)((long)pHVar6 + uVar18 * 0x48) = uVar7;
  }
  pHVar6 = (this->field_0).head;
  if (uVar7 == 0) {
    pHVar6->root = qVar17;
    uVar8 = 0;
  }
  else {
    lVar5 = uVar8 * 0x48;
    if (*(uint *)((long)pHVar6 + lVar5 + 4) == z) {
      *(quint32 *)((long)pHVar6 + lVar5 + 4) = qVar17;
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        piVar1 = (int *)((long)(this->field_0).head + lVar15 * 4 + lVar5 + 0x10);
        *piVar1 = *piVar1 - *(int *)((long)(this->field_0).head + lVar15 * 4 + lVar16 + 0x1c);
      }
    }
    else {
      *(quint32 *)((long)pHVar6 + lVar5 + 8) = qVar17;
    }
  }
LAB_00464c30:
  while( true ) {
    iVar11 = (int)uVar9;
    uVar7 = *(uint *)((long)(this->field_0).head + uVar9 * 0x48);
    if ((ulong)uVar7 == 0) break;
    lVar5 = (ulong)uVar7 * 0x48;
    uVar9 = (ulong)uVar7;
    if (*(int *)((long)(this->field_0).head + lVar5 + 4) == iVar11) {
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        piVar1 = (int *)((long)(this->field_0).head + lVar15 * 4 + lVar5 + 0x10);
        *piVar1 = *piVar1 - *(int *)((long)(this->field_0).head + lVar15 * 4 + lVar16 + 0x1c);
      }
      uVar9 = (ulong)uVar7;
    }
  }
  freeFragment(this,z);
  pHVar6 = (this->field_0).head;
  if (*(int *)((long)pHVar6 + lVar16 + 0xc) != 0) {
    uVar7 = *(uint *)((long)pHVar6 + uVar18 * 0x48);
    while (uVar9 = uVar8, uVar7 != 0) {
      if ((uVar18 != 0) && (*(int *)((long)pHVar6 + uVar18 * 0x48 + 0xc) != 1)) goto LAB_00464edd;
      lVar16 = uVar9 * 0x48;
      uVar7 = *(uint *)((long)pHVar6 + lVar16 + 4);
      uVar8 = (ulong)uVar7;
      x = (uint)uVar9;
      if ((uint)uVar18 != uVar7) {
        if (*(int *)((long)pHVar6 + uVar8 * 0x48 + 0xc) == 0) {
          *(undefined4 *)((long)pHVar6 + uVar8 * 0x48 + 0xc) = 1;
          *(undefined4 *)((long)(this->field_0).head + lVar16 + 0xc) = 0;
          rotateRight(this,x);
          pHVar6 = (this->field_0).head;
          uVar8 = (ulong)*(uint *)((long)pHVar6 + lVar16 + 4);
        }
        lVar15 = uVar8 * 0x48;
        lVar5 = (long)pHVar6 + lVar15;
        uVar10 = (ulong)*(uint *)((long)pHVar6 + lVar15 + 8);
        if ((uVar10 == 0) || (*(int *)((long)pHVar6 + uVar10 * 0x48 + 0xc) == 1)) {
          uVar12 = (ulong)*(uint *)(lVar5 + 4);
          if ((uVar12 == 0) || (*(int *)((long)pHVar6 + uVar12 * 0x48 + 0xc) == 1))
          goto LAB_00464db5;
LAB_00464e5a:
          if (*(int *)((long)pHVar6 + uVar12 * 0x48 + 0xc) == 1) {
            if (uVar10 != 0) goto LAB_00464e6d;
            goto LAB_00464e7c;
          }
        }
        else {
          uVar12 = (ulong)*(uint *)(lVar5 + 4);
          if (*(uint *)(lVar5 + 4) != 0) goto LAB_00464e5a;
LAB_00464e6d:
          *(undefined4 *)((long)pHVar6 + uVar10 * 0x48 + 0xc) = 1;
          pHVar6 = (this->field_0).head;
LAB_00464e7c:
          *(undefined4 *)((long)pHVar6 + lVar15 + 0xc) = 0;
          rotateLeft(this,*(uint *)((long)(this->field_0).head + lVar16 + 4));
          pHVar6 = (this->field_0).head;
          uVar8 = (ulong)*(uint *)((long)pHVar6 + lVar16 + 4);
        }
        *(undefined4 *)((long)pHVar6 + uVar8 * 0x48 + 0xc) =
             *(undefined4 *)((long)pHVar6 + lVar16 + 0xc);
        *(undefined4 *)((long)(this->field_0).head + lVar16 + 0xc) = 1;
        uVar9 = (ulong)*(uint *)((long)(this->field_0).head + uVar8 * 0x48 + 4);
        if (uVar9 != 0) {
          *(undefined4 *)((long)(this->field_0).head + uVar9 * 0x48 + 0xc) = 1;
        }
        rotateRight(this,x);
        break;
      }
      uVar8 = (ulong)*(uint *)((long)pHVar6 + lVar16 + 8);
      if (*(int *)((long)pHVar6 + uVar8 * 0x48 + 0xc) == 0) {
        *(undefined4 *)((long)pHVar6 + uVar8 * 0x48 + 0xc) = 1;
        *(undefined4 *)((long)(this->field_0).head + lVar16 + 0xc) = 0;
        rotateLeft(this,x);
        pHVar6 = (this->field_0).head;
        uVar8 = (ulong)*(uint *)((long)pHVar6 + lVar16 + 8);
      }
      lVar15 = uVar8 * 0x48;
      lVar5 = (long)pHVar6 + lVar15;
      uVar10 = (ulong)*(uint *)((long)pHVar6 + lVar15 + 4);
      if ((uVar10 != 0) && (*(int *)((long)pHVar6 + uVar10 * 0x48 + 0xc) != 1)) {
        uVar12 = (ulong)*(uint *)(lVar5 + 8);
        if (*(uint *)(lVar5 + 8) != 0) goto LAB_00464dd1;
LAB_00464de4:
        *(undefined4 *)((long)pHVar6 + uVar10 * 0x48 + 0xc) = 1;
        pHVar6 = (this->field_0).head;
LAB_00464df3:
        *(undefined4 *)((long)pHVar6 + lVar15 + 0xc) = 0;
        rotateRight(this,*(uint *)((long)(this->field_0).head + lVar16 + 8));
        pHVar6 = (this->field_0).head;
        uVar8 = (ulong)*(uint *)((long)pHVar6 + lVar16 + 8);
LAB_00464e10:
        *(undefined4 *)((long)pHVar6 + uVar8 * 0x48 + 0xc) =
             *(undefined4 *)((long)pHVar6 + lVar16 + 0xc);
        *(undefined4 *)((long)(this->field_0).head + lVar16 + 0xc) = 1;
        uVar9 = (ulong)*(uint *)((long)(this->field_0).head + uVar8 * 0x48 + 8);
        if (uVar9 != 0) {
          *(undefined4 *)((long)(this->field_0).head + uVar9 * 0x48 + 0xc) = 1;
        }
        rotateLeft(this,x);
        break;
      }
      uVar12 = (ulong)*(uint *)(lVar5 + 8);
      if ((uVar12 != 0) && (*(int *)((long)pHVar6 + uVar12 * 0x48 + 0xc) != 1)) {
LAB_00464dd1:
        if (*(int *)((long)pHVar6 + uVar12 * 0x48 + 0xc) == 1) {
          if (uVar10 != 0) goto LAB_00464de4;
          goto LAB_00464df3;
        }
        goto LAB_00464e10;
      }
LAB_00464db5:
      *(undefined4 *)(lVar5 + 0xc) = 0;
      pHVar6 = (this->field_0).head;
      uVar7 = *(uint *)((long)pHVar6 + lVar16);
      uVar8 = (ulong)uVar7;
      uVar18 = uVar9;
    }
    if (uVar18 != 0) {
      pHVar6 = (this->field_0).head;
LAB_00464edd:
      *(undefined4 *)((long)pHVar6 + uVar18 * 0x48 + 0xc) = 1;
    }
  }
  return uVar3;
}

Assistant:

uint QFragmentMapData<Fragment>::erase_single(uint z)
{
    uint w = previous(z);
    uint y = z;
    uint x;
    uint p;

    if (!F(y).left) {
        x = F(y).right;
    } else if (!F(y).right) {
        x = F(y).left;
    } else {
        y = F(y).right;
        while (F(y).left)
            y = F(y).left;
        x = F(y).right;
    }

    if (y != z) {
        F(F(z).left).parent = y;
        F(y).left = F(z).left;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_left_array[field];
        if (y != F(z).right) {
            /*
                     z                y
                    / \              / \
                   a   b            a   b
                      /                /
                    ...     -->      ...
                    /                /
                   y                x
                  / \
                 0   x
             */
            p = F(y).parent;
            if (x)
                F(x).parent = p;
            F(p).left = x;
            F(y).right = F(z).right;
            F(F(z).right).parent = y;
            uint n = p;
            while (n != y) {
                for (uint field = 0; field < Fragment::size_array_max; ++field)
                    F(n).size_left_array[field] -= F(y).size_array[field];
                n = F(n).parent;
            }
        } else {
            /*
                     z                y
                    / \              / \
                   a   y     -->    a   x
                      / \
                     0   x
             */
            p = y;
        }
        uint zp = F(z).parent;
        if (!zp) {
            Q_ASSERT(head->root == z);
            head->root = y;
        } else if (F(zp).left == z) {
            F(zp).left = y;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(zp).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(zp).right = y;
        }
        F(y).parent = zp;
        // Swap the colors
        uint c = F(y).color;
        F(y).color = F(z).color;
        F(z).color = c;
        y = z;
    } else {
        /*
                p          p            p          p
               /          /              \          \
              z    -->   x                z  -->     x
              |                           |
              x                           x
         */
        p = F(z).parent;
        if (x)
            F(x).parent = p;
        if (!p) {
            Q_ASSERT(head->root == z);
            head->root = x;
        } else if (F(p).left == z) {
            F(p).left = x;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(p).right = x;
        }
    }
    uint n = z;
    while (F(n).parent) {
        uint p = F(n).parent;
        if (F(p).left == n) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        }
        n = p;
    }

    freeFragment(z);


    if (F(y).color != Red) {
        while (F(x).parent && (x == 0 || F(x).color == Black)) {
            if (x == F(p).left) {
                uint w = F(p).right;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateLeft(p);
                    w = F(p).right;
                }
                if ((F(w).left == 0 || F(F(w).left).color == Black) &&
                    (F(w).right == 0 || F(F(w).right).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).right == 0 || F(F(w).right).color == Black) {
                        if (F(w).left)
                            F(F(w).left).color = Black;
                        F(w).color = Red;
                        rotateRight(F(p).right);
                        w = F(p).right;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).right)
                        F(F(w).right).color = Black;
                    rotateLeft(p);
                    break;
                }
            } else {
                uint w = F(p).left;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateRight(p);
                    w = F(p).left;
                }
                if ((F(w).right == 0 || F(F(w).right).color == Black) &&
                    (F(w).left == 0 || F(F(w).left).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).left == 0 || F(F(w).left).color == Black) {
                        if (F(w).right)
                            F(F(w).right).color = Black;
                        F(w).color = Red;
                        rotateLeft(F(p).left);
                        w = F(p).left;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).left)
                        F(F(w).left).color = Black;
                    rotateRight(p);
                    break;
                }
            }
        }
        if (x)
            F(x).color = Black;
    }

    return w;
}